

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception_assertion_tests.cpp
# Opt level: O0

void __thiscall iu_Exception_x_iutest_x_Throw_Test::Body(iu_Exception_x_iutest_x_Throw_Test *this)

{
  bool bVar1;
  bad_exception *anon_var_0_3;
  char *msg_3;
  bad_exception *anon_var_0_2;
  char *msg_2;
  bad_exception *anon_var_0_1;
  char *msg_1;
  Fixed local_1b8;
  bad_exception *anon_var_0;
  char *local_18;
  char *msg;
  iu_Exception_x_iutest_x_Throw_Test *this_local;
  
  msg = (char *)this;
  iutest::detail::AlwaysZero();
  local_18 = "";
  bVar1 = iutest::detail::AlwaysTrue();
  if (bVar1) {
    ExceptionFunction(2);
  }
  local_18 = 
  "\nExpected: ExceptionFunction(2) throws an exception of type ::std::bad_exception.\n  Actual: it throws nothing."
  ;
  memset(&local_1b8,0,0x188);
  iutest::AssertionHelper::Fixed::Fixed(&local_1b8);
  iutest::AssertionHelper::AssertionHelper
            ((AssertionHelper *)&msg_1,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/exception_assertion_tests.cpp"
             ,0x34,local_18,kFatalFailure);
  iutest::AssertionHelper::operator=((AssertionHelper *)&msg_1,&local_1b8);
  iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&msg_1);
  iutest::AssertionHelper::Fixed::~Fixed(&local_1b8);
  return;
}

Assistant:

IUTEST(Exception, Throw)
{
    //IUTEST_ASSERT_THROW(throw ::std::bad_exception(), ::std::bad_exception);
    IUTEST_ASSERT_THROW(ExceptionFunction(2), ::std::bad_exception);
    IUTEST_EXPECT_THROW(ExceptionFunction(2), ::std::bad_exception);
    IUTEST_INFORM_THROW(ExceptionFunction(2), ::std::bad_exception);
    IUTEST_ASSUME_THROW(ExceptionFunction(2), ::std::bad_exception);
}